

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O0

void __thiscall
transition_transition_size_empty_base_optimization_Test::TestBody
          (transition_transition_size_empty_base_optimization_Test *this)

{
  undefined1 local_15;
  undefined1 local_14 [4];
  transition_transition_size_empty_base_optimization_Test *ptStack_10;
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:94:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:99:9),_state_machine::transition::State<(anonymous_namespace)::s2>_>
  transition;
  transition_transition_size_empty_base_optimization_Test *this_local;
  
  ptStack_10 = this;
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,transition_transition_size_empty_base_optimization_Test::TestBody()::__0,transition_transition_size_empty_base_optimization_Test::TestBody()::__1,state_machine::transition::State<(anonymous_namespace)::s2>>
            (local_14,&local_15);
  return;
}

Assistant:

TEST(transition, transition_size_empty_base_optimization) {
    auto transition = make_transition(
        state<s1>,
        event<e1>,
        [](const auto& s, const auto& e) {
            (void)s;
            (void)e;
            return true;
        },
        [](auto& s, auto& e) {
            (void)s;
            (void)e;
            return s2{};
        },
        state<s2>);

    static_assert(sizeof(transition) == 1, "");
}